

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<0,_2,_5,_2,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float *pfVar1;
  long lVar2;
  int col;
  long lVar3;
  bool bVar4;
  undefined4 uVar5;
  Mat2 m;
  float afStack_64 [5];
  int local_50 [6];
  Matrix<float,_2,_2> local_38;
  undefined4 local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  pfVar1 = (float *)&local_38;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar2 != lVar3) {
        uVar5 = 0;
      }
      pfVar1[lVar3 * 2] = (float)uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pfVar1 = pfVar1 + 1;
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  local_38.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  local_38.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
  tcu::operator+((tcu *)&local_20,&local_38,(evalCtx->coords).m_data[0]);
  afStack_64[2] = (float)local_20;
  afStack_64[3] = (float)local_18;
  afStack_64[4] = local_1c + local_14;
  local_50[2] = 0;
  local_50[3] = 1;
  local_50[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_50[lVar2]] = afStack_64[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) + getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}